

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_compositions.cpp
# Opt level: O0

bool __thiscall
icu_63::numparse::impl::SeriesMatcher::match
          (SeriesMatcher *this,StringSegment *segment,ParsedNumber *result,UErrorCode *status)

{
  _func_int **pp_Var1;
  byte bVar2;
  int32_t start;
  int iVar3;
  int32_t iVar4;
  int32_t iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  bool isFlexible;
  bool success;
  int matcherOffset;
  NumberParseMatcher *matcher;
  NumberParseMatcher **it;
  bool maybeMore;
  undefined1 local_110 [4];
  int32_t initialOffset;
  ParsedNumber backup;
  UErrorCode *status_local;
  ParsedNumber *result_local;
  StringSegment *segment_local;
  SeriesMatcher *this_local;
  
  backup.currencyCode = (UChar  [4])status;
  ParsedNumber::ParsedNumber((ParsedNumber *)local_110,result);
  start = StringSegment::getOffset(segment);
  it._3_1_ = true;
  iVar3 = (*(this->super_CompositionMatcher).super_NumberParseMatcher._vptr_NumberParseMatcher[7])()
  ;
  matcher = (NumberParseMatcher *)CONCAT44(extraout_var,iVar3);
  do {
    do {
      iVar3 = (*(this->super_CompositionMatcher).super_NumberParseMatcher._vptr_NumberParseMatcher
                [8])();
      if ((NumberParseMatcher *)CONCAT44(extraout_var_00,iVar3) <= matcher) {
        this_local._7_1_ = it._3_1_;
LAB_00312d0d:
        ParsedNumber::~ParsedNumber((ParsedNumber *)local_110);
        return this_local._7_1_;
      }
      pp_Var1 = matcher->_vptr_NumberParseMatcher;
      iVar4 = StringSegment::getOffset(segment);
      iVar5 = StringSegment::length(segment);
      if (iVar5 == 0) {
        it._3_1_ = true;
      }
      else {
        bVar2 = (**(code **)(*pp_Var1 + 0x18))(pp_Var1,segment,result,backup.currencyCode);
        it._3_1_ = (bool)(bVar2 & 1);
      }
      iVar5 = StringSegment::getOffset(segment);
      bVar2 = (**(code **)(*pp_Var1 + 0x10))();
    } while ((iVar5 != iVar4) && ((bVar2 & 1) != 0));
    if (iVar5 == iVar4) {
      if ((bVar2 & 1) == 0) {
        StringSegment::setOffset(segment,start);
        ParsedNumber::operator=(result,(ParsedNumber *)local_110);
        this_local._7_1_ = it._3_1_;
        goto LAB_00312d0d;
      }
    }
    else {
      iVar3 = (*(this->super_CompositionMatcher).super_NumberParseMatcher._vptr_NumberParseMatcher
                [8])();
      if (((matcher + 1 < (NumberParseMatcher *)CONCAT44(extraout_var_01,iVar3)) &&
          (iVar5 = StringSegment::getOffset(segment), iVar5 != result->charEnd)) &&
         (iVar4 < result->charEnd)) {
        StringSegment::setOffset(segment,result->charEnd);
      }
    }
    matcher = matcher + 1;
  } while( true );
}

Assistant:

bool SeriesMatcher::match(StringSegment& segment, ParsedNumber& result, UErrorCode& status) const {
    ParsedNumber backup(result);

    int32_t initialOffset = segment.getOffset();
    bool maybeMore = true;
    for (auto* it = begin(); it < end();) {
        const NumberParseMatcher* matcher = *it;
        int matcherOffset = segment.getOffset();
        if (segment.length() != 0) {
            maybeMore = matcher->match(segment, result, status);
        } else {
            // Nothing for this matcher to match; ask for more.
            maybeMore = true;
        }

        bool success = (segment.getOffset() != matcherOffset);
        bool isFlexible = matcher->isFlexible();
        if (success && isFlexible) {
            // Match succeeded, and this is a flexible matcher. Re-run it.
        } else if (success) {
            // Match succeeded, and this is NOT a flexible matcher. Proceed to the next matcher.
            it++;
            // Small hack: if there is another matcher coming, do not accept trailing weak chars.
            // Needed for proper handling of currency spacing.
            if (it < end() && segment.getOffset() != result.charEnd && result.charEnd > matcherOffset) {
                segment.setOffset(result.charEnd);
            }
        } else if (isFlexible) {
            // Match failed, and this is a flexible matcher. Try again with the next matcher.
            it++;
        } else {
            // Match failed, and this is NOT a flexible matcher. Exit.
            segment.setOffset(initialOffset);
            result = backup;
            return maybeMore;
        }
    }

    // All matchers in the series succeeded.
    return maybeMore;
}